

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnUnspecifiedCrate
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player)

{
  code *pcVar1;
  string msg;
  undefined8 local_40;
  long local_38;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x32 & 1) == 0) {
    pcVar1 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar1 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_40,&this->unspecifiedCrateFmt);
  if (local_38 != 0) {
    RenX::processTags((string *)&local_40,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    (*pcVar1)(server,local_38,local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnUnspecifiedCrate(RenX::Server &server, const RenX::PlayerInfo &player)
{
	logFuncType func;
	if (RenX_LoggingPlugin::unspecifiedCratePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->unspecifiedCrateFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		(server.*func)(msg);
	}
}